

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  undefined8 *puVar1;
  Command *base;
  Action *action;
  Expectation *expect;
  Errors *errors_00;
  ModuleCommand *pMVar2;
  AssertTrapCommandBase<(wabt::CommandType)10> *pAVar3;
  AssertReturnCommand *pAVar4;
  char *in_R8;
  undefined8 *puVar5;
  ActionResult AVar6;
  ScriptValidator validator;
  Validator module_validator;
  ScriptValidator local_300;
  anon_union_8_2_516a9242_for_ActionResult_2 local_2e0;
  Validator local_2d8;
  
  local_300.result_.enum_ = Ok;
  puVar5 = *(undefined8 **)script;
  puVar1 = *(undefined8 **)&script->field_0x8;
  local_300.options_ = options;
  local_300.errors_ = errors;
  local_300.script_ = script;
  do {
    errors_00 = local_300.errors_;
    if (puVar5 == puVar1) {
      return (Result)local_300.result_.enum_;
    }
    base = (Command *)*puVar5;
    switch(*(undefined4 *)(base + 8)) {
    case 0:
      pMVar2 = cast<wabt::ModuleCommand,wabt::Command>(base);
      goto LAB_0013083a;
    case 1:
      pMVar2 = (ModuleCommand *)cast<wabt::ScriptModuleCommand,wabt::Command>(base);
LAB_0013083a:
      anon_unknown_4::Validator::Validator
                (&local_2d8,errors_00,(Module *)(pMVar2 + 0x10),local_300.options_);
      anon_unknown_4::Validator::CheckModule(&local_2d8);
      anon_unknown_4::Validator::~Validator(&local_2d8);
      goto switchD_00130818_caseD_3;
    case 2:
      pAVar3 = (AssertTrapCommandBase<(wabt::CommandType)10> *)
               cast<wabt::ActionCommandBase<(wabt::CommandType)2>,wabt::Command>(base);
      break;
    default:
      goto switchD_00130818_caseD_3;
    case 8:
      pAVar4 = cast<wabt::AssertReturnCommand,wabt::Command>(base);
      action = *(Action **)(pAVar4 + 0x10);
      AVar6 = anon_unknown_4::ScriptValidator::CheckAction(&local_300,action);
      expect = *(Expectation **)(pAVar4 + 0x18);
      if (AVar6.kind == Type) {
        local_2d8.super_Delegate._vptr_Delegate = (_func_int **)0x0;
        local_2d8.options_ = (ValidateOptions *)0x0;
        local_2d8.errors_ = (Errors *)0x0;
        local_2e0 = AVar6.field_1;
        std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
                  ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_2d8,&local_2e0,&local_2d8
                  );
        anon_unknown_4::ScriptValidator::CheckExpectationTypes
                  (&local_300,(Location *)(action + 8),(TypeVector *)&local_2d8,expect,in_R8);
        std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                  ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2d8);
      }
      else if (AVar6.kind == Types) {
        anon_unknown_4::ScriptValidator::CheckExpectationTypes
                  (&local_300,(Location *)(action + 8),AVar6.field_1.types,expect,in_R8);
      }
      goto switchD_00130818_caseD_3;
    case 9:
      pAVar3 = (AssertTrapCommandBase<(wabt::CommandType)10> *)
               cast<wabt::AssertTrapCommandBase<(wabt::CommandType)9>,wabt::Command>(base);
      break;
    case 10:
      pAVar3 = cast<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,wabt::Command>(base);
      break;
    case 0xb:
      pAVar3 = (AssertTrapCommandBase<(wabt::CommandType)10> *)
               cast<wabt::AssertExceptionCommand,wabt::Command>(base);
    }
    anon_unknown_4::ScriptValidator::CheckAction(&local_300,*(Action **)(pAVar3 + 0x10));
switchD_00130818_caseD_3:
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

Result ValidateScript(const Script* script,
                      Errors* errors,
                      const ValidateOptions& options) {
  ScriptValidator validator(errors, script, options);

  return validator.CheckScript();
}